

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_InitPriceTables(UInt32 *ProbPrices)

{
  int j;
  UInt32 bitCount;
  UInt32 w;
  int kCyclesBits;
  UInt32 i;
  UInt32 *ProbPrices_local;
  
  for (i = 8; i < 0x800; i = i + 0x10) {
    w = i;
    bitCount = 0;
    for (j = 0; j < 4; j = j + 1) {
      bitCount = bitCount << 1;
      for (w = w * w; 0xffff < w; w = w >> 1) {
        bitCount = bitCount + 1;
      }
    }
    ProbPrices[i >> 4] = 0xa1 - bitCount;
  }
  return;
}

Assistant:

void LzmaEnc_InitPriceTables(UInt32* ProbPrices) {
  UInt32 i;
  for (i = (1 << kNumMoveReducingBits) / 2; i < kBitModelTotal; i += (1 << kNumMoveReducingBits)) {
    const int kCyclesBits = kNumBitPriceShiftBits;
    UInt32 w = i;
    UInt32 bitCount = 0;
    int j;
    for (j = 0; j < kCyclesBits; j++) {
      w = w * w;
      bitCount <<= 1;
      while (w >= ((UInt32)1 << 16)) {
        w >>= 1;
        bitCount++;
      }
    }
    ProbPrices[i >> kNumMoveReducingBits] = ((kNumBitModelTotalBits << kCyclesBits) - 15 - bitCount);
  }
}